

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void finishCcall(lua_State *L,int status)

{
  CallInfo *ci_00;
  int nres;
  int n;
  CallInfo *ci;
  int status_local;
  lua_State *L_local;
  
  ci_00 = L->ci;
  if ((ci_00->callstatus & 0x10) != 0) {
    ci_00->callstatus = ci_00->callstatus & 0xffef;
    L->errfunc = (ptrdiff_t)(ci_00->u).l.savedpc;
  }
  if ((ci_00->nresults == -1) && (L->ci->top < L->top)) {
    L->ci->top = L->top;
  }
  nres = (*(ci_00->u).c.k)(L,status,(ci_00->u).c.ctx);
  luaD_poscall(L,ci_00,L->top + -(long)nres,nres);
  return;
}

Assistant:

static void finishCcall(lua_State *L, int status) {
    CallInfo *ci = L->ci;
    int n;
    /* must have a continuation and must be able to call it */
    lua_assert(ci->u.c.k != NULL && L->nny == 0);
    /* error status can only happen in a protected call */
    lua_assert((ci->callstatus & CIST_YPCALL) || status == LUA_YIELD);
    if (ci->callstatus & CIST_YPCALL) {  /* was inside a pcall? */
        ci->callstatus &= ~CIST_YPCALL;  /* continuation is also inside it */
        L->errfunc = ci->u.c.old_errfunc;  /* with the same error function */
    }
    /* finish 'lua_callk'/'lua_pcall'; CIST_YPCALL and 'errfunc' already
       handled */
    adjustresults(L, ci->nresults);
    lua_unlock(L);
    n = (*ci->u.c.k)(L, status, ci->u.c.ctx);  /* call continuation function */
    lua_lock(L);
    api_checknelems(L, n);
    luaD_poscall(L, ci, L->top - n, n);  /* finish 'luaD_precall' */
}